

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

string * __thiscall
efsw::String::toAnsiString_abi_cxx11_(string *__return_storage_ptr__,String *this,locale *locale)

{
  __normal_iterator<const_unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  begin;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  begin._M_current = (this->mString)._M_dataplus._M_p;
  Utf<32u>::
  ToAnsi<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::__cxx11::basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::__cxx11::string>>
            (begin,(__normal_iterator<const_unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
                    )(begin._M_current + (this->mString)._M_string_length),
             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__,'\0',locale);
  return __return_storage_ptr__;
}

Assistant:

std::string String::toAnsiString(const std::locale& locale) const
{
	// Prepare the output string
	std::string output;
	output.reserve(mString.length() + 1);

	// Convert
	Utf32::ToAnsi(mString.begin(), mString.end(), std::back_inserter(output), 0, locale);

	return output;
}